

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O1

uint32_t ans_reorder_fold_undo_mapping(dec_entry_reorder_fold *entry,uint8_t **in_u8)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = entry->mapped_num;
  uVar4 = (ulong)(uVar1 >> 0x1e);
  uVar2 = ans_fold_undo_mapping::except_mask._M_elems[uVar4];
  uVar3 = *(uint *)(*in_u8 + -uVar4);
  *in_u8 = *in_u8 + -uVar4;
  return (uVar2 & uVar3) + (uVar1 & 0x3fffffff);
}

Assistant:

uint32_t ans_reorder_fold_undo_mapping(
    const dec_entry_reorder_fold& entry, const uint8_t*& in_u8)
{
    uint32_t except_bytes = entry.mapped_num >> 30;
    uint32_t mapped_num = entry.mapped_num & 0x3FFFFFFF;
    static std::array<uint32_t, 4> except_mask
        = { 0x0, 0xFF, 0xFFFF, 0xFFFFFF };
    auto u32_ptr = in_u8 - except_bytes;
    auto except_u32 = reinterpret_cast<const uint32_t*>(u32_ptr);
    uint32_t num = mapped_num + (*except_u32 & except_mask[except_bytes]);
    in_u8 -= except_bytes;
    return num;
}